

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Vec_Ptr_t * Aig_ManDfsNodes(Aig_Man_t *p,Aig_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  int iVar4;
  Aig_Obj_t *pObj;
  ulong uVar5;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < (iVar2 + iVar1) - 1U) {
    iVar4 = iVar2 + iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar4 << 3);
  }
  vNodes->pArray = ppvVar3;
  if (0 < nNodes) {
    uVar5 = 0;
    do {
      pObj = ppNodes[uVar5];
      if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
        pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      }
      Aig_ManDfs_rec(p,pObj,vNodes);
      uVar5 = uVar5 + 1;
    } while ((uint)nNodes != uVar5);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsNodes( Aig_Man_t * p, Aig_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
//    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark constant and PIs
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
//    Aig_ManForEachCi( p, pObj, i )
//        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    for ( i = 0; i < nNodes; i++ )
        if ( Aig_ObjIsCo(ppNodes[i]) )
            Aig_ManDfs_rec( p, Aig_ObjFanin0(ppNodes[i]), vNodes );
        else
            Aig_ManDfs_rec( p, ppNodes[i], vNodes );
    return vNodes;
}